

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

void andnot_test(void)

{
  int iVar1;
  bitset_container_t *pbVar2;
  bitset_container_t *pbVar3;
  bitset_container_t *bitset;
  int expected;
  size_t x_1;
  size_t x;
  bitset_container_t *TMP;
  bitset_container_t *BI;
  bitset_container_t *B2;
  bitset_container_t *B1;
  bitset_container_t *in_stack_ffffffffffffffb8;
  int line;
  bitset_container_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  unsigned_long in_stack_ffffffffffffffd0;
  ulong a;
  undefined8 local_28;
  
  pbVar2 = bitset_container_create();
  pbVar3 = bitset_container_create();
  bitset = bitset_container_create();
  bitset_container_create();
  _assert_true(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  for (local_28 = 0; local_28 < 0x10000; local_28 = local_28 + 3) {
    bitset_container_set(pbVar2,(uint16_t)local_28);
    bitset_container_set(bitset,(uint16_t)local_28);
  }
  for (a = 0; a < 0x10000; a = a + 0x3e) {
    bitset_container_set(pbVar3,(uint16_t)a);
    bitset_container_remove(bitset,(uint16_t)a);
  }
  iVar1 = bitset_container_compute_cardinality(in_stack_ffffffffffffffb8);
  bitset_container_andnot_nocard
            ((bitset_container_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pbVar2 = (bitset_container_t *)(long)iVar1;
  bitset_container_compute_cardinality(pbVar2);
  _assert_int_equal(a,CONCAT44(iVar1,in_stack_ffffffffffffffc8),(char *)in_stack_ffffffffffffffc0,
                    (int)((ulong)pbVar2 >> 0x20));
  bitset_container_equals
            ((bitset_container_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0);
  _assert_true(a,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),(char *)in_stack_ffffffffffffffc0
               ,(int)((ulong)pbVar2 >> 0x20));
  pbVar3 = (bitset_container_t *)(long)iVar1;
  bitset_container_andnot
            ((bitset_container_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),pbVar3,pbVar2);
  line = (int)((ulong)pbVar2 >> 0x20);
  _assert_int_equal(a,CONCAT44(iVar1,in_stack_ffffffffffffffc8),(char *)pbVar3,line);
  bitset_container_equals((bitset_container_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),pbVar3);
  _assert_true(a,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),(char *)pbVar3,line);
  bitset_container_free((bitset_container_t *)0x1037fa);
  bitset_container_free((bitset_container_t *)0x103804);
  bitset_container_free((bitset_container_t *)0x10380e);
  bitset_container_free((bitset_container_t *)0x103818);
  return;
}

Assistant:

DEFINE_TEST(andnot_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* TMP = bitset_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        bitset_container_set(B2, x);
        bitset_container_remove(BI, x);
    }

    const int expected = bitset_container_compute_cardinality(BI);

    bitset_container_andnot_nocard(B1, B2, TMP);

    assert_int_equal(expected, bitset_container_compute_cardinality(TMP));
    assert_true(bitset_container_equals(BI, TMP));

    assert_int_equal(expected, bitset_container_andnot(B1, B2, TMP));
    assert_true(bitset_container_equals(BI, TMP));

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(TMP);
}